

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<float,unsigned_char>
          (BaseAppender *this,Vector *col,float input)

{
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  uchar result;
  data_t local_3d;
  float local_3c;
  string local_38;
  
  this_01 = (duckdb *)0x0;
  local_3c = input;
  bVar1 = TryCast::Operation<float,unsigned_char>(input,&local_3d,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_3d;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<float,unsigned_char>(&local_38,this_01,local_3c);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}